

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_soft_max_ext_back_inplace
          (ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,float scale,float max_bias)

{
  ggml_tensor *pgVar1;
  undefined8 in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *in_RDI;
  undefined4 in_XMM0_Da;
  ggml_context *unaff_retaddr;
  
  pgVar1 = ggml_soft_max_ext_back_impl
                     (unaff_retaddr,in_RDI,in_RSI,(float)((ulong)in_RDX >> 0x20),(float)in_RDX,
                      SUB41((uint)in_XMM0_Da >> 0x18,0));
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_soft_max_ext_back_inplace(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        float                 scale,
        float                 max_bias) {
    return ggml_soft_max_ext_back_impl(ctx, a, b, scale, max_bias, true);
}